

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O3

void mk_server_listen_exit(mk_list *list)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_list *pmVar3;
  mk_list *pmVar4;
  mk_list *__mptr;
  
  if (list == (mk_list *)0x0) {
    return;
  }
  pmVar4 = list->next;
  while (pmVar4 != list) {
    pmVar1 = pmVar4->next;
    close(*(int *)&pmVar4[-2].prev);
    pmVar2 = pmVar4->prev;
    pmVar3 = pmVar4->next;
    pmVar2->next = pmVar3;
    pmVar3->prev = pmVar2;
    pmVar4->prev = (mk_list *)0x0;
    pmVar4->next = (mk_list *)0x0;
    free(&pmVar4[-7].next);
    pmVar4 = pmVar1;
  }
  free(list);
  return;
}

Assistant:

void mk_server_listen_exit(struct mk_list *list)
{
    struct mk_list *tmp;
    struct mk_list *head;
    struct mk_server_listen *listen;

    if (!list) {
        return;
    }

    mk_list_foreach_safe(head, tmp, list) {
        listen = mk_list_entry(head, struct mk_server_listen, _head);
        mk_event_closesocket(listen->server_fd);
        mk_list_del(&listen->_head);
        mk_mem_free(listen);
    }

    mk_mem_free(list);
}